

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MeshTopology::TopEdgeIsHidden(ON_MeshTopology *this,int topei)

{
  int iVar1;
  int iVar2;
  ON_Mesh *pOVar3;
  ON_MeshTopologyVertex *pOVar4;
  ON_MeshTopologyEdge *pOVar5;
  bool bVar6;
  bool *pbVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  pOVar3 = this->m_mesh;
  if (((pOVar3 == (ON_Mesh *)0x0) || (pOVar3->m_hidden_count < 1)) ||
     ((pOVar3->m_H).m_count != (pOVar3->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
    pbVar7 = (bool *)0x0;
  }
  else {
    pbVar7 = (pOVar3->m_H).m_a;
  }
  bVar6 = false;
  if (((-1 < topei) && (bVar6 = false, pbVar7 != (bool *)0x0)) && (topei < (this->m_tope).m_count))
  {
    pOVar4 = (this->m_topv).m_a;
    pOVar5 = (this->m_tope).m_a;
    iVar1 = pOVar5[(uint)topei].m_topvi[0];
    uVar8 = (ulong)pOVar4[iVar1].m_v_count;
    bVar6 = true;
    bVar11 = 0 < (long)uVar8;
    if (0 < (long)uVar8) {
      iVar2 = pOVar5[(uint)topei].m_topvi[1];
      if (pbVar7[*pOVar4[iVar1].m_vi] == true) {
        uVar10 = 0;
        do {
          if (uVar8 - 1 == uVar10) {
            return true;
          }
          lVar9 = uVar10 + 1;
          uVar10 = uVar10 + 1;
        } while (pbVar7[pOVar4[iVar1].m_vi[lVar9]] != false);
        bVar11 = uVar10 < uVar8;
      }
      if (bVar11) {
        if (0 < (long)pOVar4[iVar2].m_v_count) {
          lVar9 = 0;
          do {
            if (pbVar7[pOVar4[iVar2].m_vi[lVar9]] != true) {
              return pbVar7[pOVar4[iVar2].m_vi[lVar9]];
            }
            bVar11 = (long)pOVar4[iVar2].m_v_count + -1 != lVar9;
            bVar6 = true;
            lVar9 = lVar9 + 1;
          } while (bVar11);
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool ON_MeshTopology::TopEdgeIsHidden( int topei ) const
{
  // ugly - but faster than calling TopVertexIsHidden()
  const bool* bHiddenVertex = m_mesh ? m_mesh->HiddenVertexArray() : 0;
  if ( bHiddenVertex && topei >= 0 && topei < m_tope.Count()  )
  {
    const ON_MeshTopologyEdge& tope = m_tope[topei];
    const ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
    const ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
    int i;

    for ( i = 0; i < topv0.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv0.m_vi[i]] )
        break;
    }
    if ( i >= topv0.m_v_count )
      return true;

    for ( i = 0; i < topv1.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv1.m_vi[i]] )
        return false;
    }

    return true;
  }
  return false;
}